

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_buffer.cpp
# Opt level: O2

bool template_image::Constructor(void)

{
  uchar colorCount_;
  uchar alignment_;
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t rowSize;
  uint uVar5;
  ImageTemplate<unsigned_char> local_58;
  
  uVar5 = 0xffffffff;
  do {
    uVar2 = Test_Helper::runCount();
    uVar5 = uVar5 + 1;
    if (uVar2 <= uVar5) break;
    uVar3 = rand();
    uVar3 = uVar3 & 0x7ff;
    uVar4 = rand();
    colorCount_ = Test_Helper::randomValue<unsigned_char>('\x01',4);
    alignment_ = Test_Helper::randomValue<unsigned_char>('\x01',0x20);
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              (&local_58,uVar3,uVar4 & 0x7ff,colorCount_,alignment_);
    rowSize = Unit_Test::rowSize(uVar3,colorCount_,alignment_);
    bVar1 = Unit_Test::equalSize<PenguinV_Image::ImageTemplate<unsigned_char>>
                      (&local_58,uVar3,uVar4 & 0x7ff,rowSize,colorCount_,alignment_);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_58);
  } while (bVar1);
  return uVar2 <= uVar5;
}

Assistant:

bool Constructor()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const uint32_t width      = Unit_Test::randomValue<uint32_t>( 2048 );
            const uint32_t height     = Unit_Test::randomValue<uint32_t>( 2048 );
            const uint8_t  colorCount = Unit_Test::randomValue<uint8_t >( 1, 4 );
            const uint8_t  alignment  = Unit_Test::randomValue<uint8_t >( 1, 32 );

            if( !Unit_Test::equalSize( PenguinV_Image::ImageTemplate < uint8_t >( width, height, colorCount, alignment ), width, height,
                                       Unit_Test::rowSize( width, colorCount, alignment ), colorCount, alignment ) )
                return false;
        }

        return true;
    }